

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

void __thiscall
cmCTestTestHandler::AttachFiles(cmCTestTestHandler *this,cmXMLWriter *xml,cmCTestTestResult *result)

{
  cmCTestTestProperties *pcVar1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  pointer pbVar2;
  pointer file;
  string fname;
  allocator<char> local_99;
  cmCTestTestHandler *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  local_98 = this;
  if (result->Status != 9) {
    pcVar1 = result->Properties;
    __first._M_current =
         (pcVar1->AttachOnFail).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         (pcVar1->AttachOnFail).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__first._M_current != __last._M_current) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &pcVar1->AttachedFiles,
                 (pcVar1->AttachedFiles).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,__first,__last);
    }
  }
  pbVar2 = (result->Properties->AttachedFiles).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (file = (result->Properties->AttachedFiles).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start; file != pbVar2; file = file + 1) {
    cmCTest::Base64GzipEncodeFile(&local_50,(local_98->super_cmCTestGenericHandler).CTest,file);
    cmsys::SystemTools::GetFilenameName(&local_70,file);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"NamedMeasurement",&local_99);
    cmXMLWriter::StartElement(xml,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    cmXMLWriter::Attribute<char[14]>(xml,"name",(char (*) [14])"Attached File");
    cmXMLWriter::Attribute<char[7]>(xml,"encoding",(char (*) [7])"base64");
    cmXMLWriter::Attribute<char[9]>(xml,"compression",(char (*) [9])"tar/gzip");
    cmXMLWriter::Attribute<std::__cxx11::string>(xml,"filename",&local_70);
    cmXMLWriter::Attribute<char[5]>(xml,"type",(char (*) [5])0x4b24de);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"Value",&local_99);
    cmXMLWriter::Element<std::__cxx11::string>(xml,&local_90,&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    cmXMLWriter::EndElement(xml);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void cmCTestTestHandler::AttachFiles(cmXMLWriter& xml,
                                     cmCTestTestResult& result)
{
  if (result.Status != cmCTestTestHandler::COMPLETED &&
      !result.Properties->AttachOnFail.empty()) {
    result.Properties->AttachedFiles.insert(
      result.Properties->AttachedFiles.end(),
      result.Properties->AttachOnFail.begin(),
      result.Properties->AttachOnFail.end());
  }
  for (std::string const& file : result.Properties->AttachedFiles) {
    const std::string& base64 = this->CTest->Base64GzipEncodeFile(file);
    std::string const fname = cmSystemTools::GetFilenameName(file);
    xml.StartElement("NamedMeasurement");
    xml.Attribute("name", "Attached File");
    xml.Attribute("encoding", "base64");
    xml.Attribute("compression", "tar/gzip");
    xml.Attribute("filename", fname);
    xml.Attribute("type", "file");
    xml.Element("Value", base64);
    xml.EndElement(); // NamedMeasurement
  }
}